

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::EglConfig::~EglConfig(EglConfig *this)

{
  EglConfig *this_local;
  
  ~EglConfig(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

~EglConfig			(void) {}